

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::
CreateTexture<unsigned_char,1,true,3u,true>(StorageAndSubImageTest *this)

{
  GLuint *pGVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GLenum target;
  GLint internalformat;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pGVar1 = &this->m_to;
  (**(code **)(lVar5 + 0x6f8))(1,pGVar1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8bc);
  (**(code **)(lVar5 + 0xb8))(0x806f,this->m_to);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8bf);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  internalformat = 3;
  (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x1398))(0x806f,1,0x8229,2,3,4);
  dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
  target = 0x1b119fd;
  glu::checkError(dVar4,"glTexStorage3D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x759);
  bVar2 = TextureSubImage<3u,true>(this,target,this->m_to,0,internalformat,2,3,4,0x1903,0x1401,"");
  if (!bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x480))(1,pGVar1);
      *pGVar1 = 0;
    }
  }
  return bVar2;
}

Assistant:

bool StorageAndSubImageTest::CreateTexture()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(TextureTarget<D>(), m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	/* Storage creation. */
	if (TextureStorage<D, I>(TextureTarget<D>(), m_to, 1, InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(),
							 TestReferenceDataHeight<D>(), TestReferenceDataDepth<D>()))
	{
		/* Data setup. */
		if (TextureSubImage<D, I>(TextureTarget<D>(), m_to, 0, InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(),
								  TestReferenceDataHeight<D>(), TestReferenceDataDepth<D>(), Format<S, N>(), Type<T>(),
								  ReferenceData<T, N>()))
		{
			return true;
		}
	}

	CleanTexture();

	return false;
}